

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits.hpp
# Opt level: O2

pair<bool,_int>
jsoncons::
json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::pair<bool,_int>,_void>
::as(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j)

{
  bool bVar1;
  uint uVar2;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar3;
  
  pbVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(j,0);
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_bool(pbVar3);
  pbVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(j,1);
  uVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_integer<int>(pbVar3);
  return (pair<bool,_int>)((ulong)uVar2 << 0x20 | (ulong)bVar1);
}

Assistant:

static std::pair<T1,T2> as(const Json& j)
        {
            return std::make_pair<T1,T2>(j[0].template as<T1>(),j[1].template as<T2>());
        }